

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.h
# Opt level: O0

void __thiscall sznet::net::KcpTcpEventLoop::assertVessels(KcpTcpEventLoop *this)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  KcpTcpEventLoop *this_local;
  
  sVar1 = std::
          map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
          ::size(&this->m_tcpConnections);
  sVar2 = std::
          map<unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
          ::size(&this->m_kcpConnections);
  if (sVar1 != sVar2) {
    __assert_fail("m_tcpConnections.size() == m_kcpConnections.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.h"
                  ,0x9f,"void sznet::net::KcpTcpEventLoop::assertVessels()");
  }
  sVar1 = std::
          map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
          ::size(&this->m_tcpConnections);
  sVar3 = std::
          unordered_map<sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
          ::size(&this->m_addrConns);
  if (sVar1 != sVar3) {
    __assert_fail("m_tcpConnections.size() == m_addrConns.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.h"
                  ,0xa0,"void sznet::net::KcpTcpEventLoop::assertVessels()");
  }
  sVar1 = std::
          map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
          ::size(&this->m_tcpConnections);
  sVar4 = std::
          map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
          ::size(&this->m_crypts);
  if (sVar1 != sVar4) {
    __assert_fail("m_tcpConnections.size() == m_crypts.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.h"
                  ,0xa1,"void sznet::net::KcpTcpEventLoop::assertVessels()");
  }
  sVar1 = std::
          map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
          ::size(&this->m_tcpConnections);
  sVar3 = std::
          unordered_map<sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
          ::size(&this->m_addrConns);
  if (sVar1 == sVar3) {
    return;
  }
  __assert_fail("m_tcpConnections.size() == m_addrConns.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.h"
                ,0xa2,"void sznet::net::KcpTcpEventLoop::assertVessels()");
}

Assistant:

void assertVessels()
	{
		assert(m_tcpConnections.size() == m_kcpConnections.size());
		assert(m_tcpConnections.size() == m_addrConns.size());
		assert(m_tcpConnections.size() == m_crypts.size());
		assert(m_tcpConnections.size() == m_addrConns.size());
	}